

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O2

void crnlib::get_command_line_as_single_string(dynamic_string *cmd_line,int argc,char **argv)

{
  ulong uVar1;
  dynamic_string tmp;
  dynamic_string local_70;
  char **local_60;
  ulong local_58;
  dynamic_string local_50;
  dynamic_string local_40;
  
  local_60 = argv;
  dynamic_string::clear(cmd_line);
  uVar1 = 0;
  local_58 = (ulong)(uint)argc;
  if (argc < 1) {
    local_58 = uVar1;
  }
  for (; local_58 != uVar1; uVar1 = uVar1 + 1) {
    dynamic_string::dynamic_string(&local_70,local_60[uVar1]);
    if (((local_70.m_len == 0) || (0x1e < (byte)*local_70.m_pStr - 0x22)) ||
       ((0x40000801U >> ((byte)*local_70.m_pStr - 0x22 & 0x1f) & 1) == 0)) {
      operator+((crnlib *)&local_50,"\"",&local_70);
      operator+((crnlib *)&local_40,&local_50,"\"");
      dynamic_string::operator=(&local_70,&local_40);
      dynamic_string::~dynamic_string(&local_40);
      dynamic_string::~dynamic_string(&local_50);
    }
    if (cmd_line->m_len != 0) {
      dynamic_string::append(cmd_line," ");
    }
    dynamic_string::append(cmd_line,&local_70);
    dynamic_string::~dynamic_string(&local_70);
  }
  return;
}

Assistant:

void get_command_line_as_single_string(dynamic_string& cmd_line, int argc, char* argv[]) {
  argc, argv;
#if CRNLIB_USE_WIN32_API
  cmd_line.set(GetCommandLineA());
#else
  cmd_line.clear();
  for (int i = 0; i < argc; i++) {
    dynamic_string tmp(argv[i]);
    if ((tmp.front() != '"') && (tmp.front() != '-') && (tmp.front() != '@'))
      tmp = "\"" + tmp + "\"";
    if (cmd_line.get_len())
      cmd_line += " ";
    cmd_line += tmp;
  }
#endif
}